

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O0

int wrapped_fgetc(FILE *stream)

{
  int fd;
  long lVar1;
  code *pcVar2;
  undefined8 uStack_60;
  int return_val;
  curious_read_record_t io_args;
  curious_file_record_t *record;
  char *mount_point;
  char *filesystem;
  fgetc_f orig_fgetc;
  FILE *stream_local;
  
  lVar1 = __tls_get_addr(&PTR_00550710);
  *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + 1;
  pcVar2 = (code *)gotcha_get_wrappee(io_fns[0x1f].handle);
  lVar1 = __tls_get_addr(&PTR_00550710);
  if ((*(int *)(lVar1 + 0xc) == 1) && (wrappers_enabled != 0)) {
    fd = fileno((FILE *)stream);
    io_args._32_8_ = get_curious_file_record(fd);
    if ((curious_file_record_t *)io_args._32_8_ == (curious_file_record_t *)0x0) {
      mount_point = (char *)0x0;
      record = (curious_file_record_t *)0x0;
    }
    else {
      mount_point = ((curious_file_record_t *)io_args._32_8_)->filesystem;
      record = (curious_file_record_t *)((curious_file_record_t *)io_args._32_8_)->mount_point;
    }
    uStack_60 = 0;
    io_args.bytes_read._0_4_ = 0;
    io_args._8_8_ = mount_point;
    io_args.filesystem = (char *)record;
    io_args.mount_point._0_4_ = 0x1f;
    curious_call_callbacks(0,&stack0xffffffffffffffa0);
    stream_local._4_4_ = (*pcVar2)(stream);
    io_args.bytes_read._0_4_ = 1;
    if (stream_local._4_4_ != -1) {
      uStack_60 = 1;
    }
    curious_call_callbacks(1,&stack0xffffffffffffffa0);
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
  }
  else {
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    stream_local._4_4_ = (*pcVar2)(stream);
  }
  return stream_local._4_4_;
}

Assistant:

int wrapped_fgetc(FILE* stream)
{
    WRAPPER_ENTER(fgetc);

    // Get the handle for the original function
    fgetc_f orig_fgetc = (fgetc_f) gotcha_get_wrappee(io_fns[CURIOUS_FGETC_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(fileno(stream));
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_read_record_t io_args = {
            .bytes_read  = 0,
            .call_count  = 0,
            .filesystem  = filesystem,
            .mount_point = mount_point,
            .function_id = CURIOUS_FGETC_ID,
        };
        curious_call_callbacks(CURIOUS_READ_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_fgetc(stream);
        io_args.call_count = 1;
        if (EOF != return_val) {
            io_args.bytes_read = 1;
        }

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_READ_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, fgetc);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_fgetc(stream), fgetc);
    }
}